

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.h
# Opt level: O1

from_chars_result_t<char>
fast_float::from_chars<int,char,int>(char *first,char *last,int *value,int base)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  undefined8 uVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  from_chars_result_t<char> fVar11;
  
  uVar4 = 0x16;
  if (base - 0x25U < 0xffffffdd || first == last) goto LAB_0012ece1;
  cVar1 = *first;
  pbVar5 = (byte *)(first + (cVar1 == '-'));
  pbVar7 = pbVar5;
  for (pbVar6 = pbVar5; (pbVar6 != (byte *)last && (pbVar7 = pbVar6, *pbVar6 == 0x30));
      pbVar6 = pbVar6 + 1) {
    pbVar7 = (byte *)last;
  }
  pbVar6 = pbVar7;
  if ((base == 10) && (lVar10 = (long)last - (long)pbVar7, 7 < lVar10)) {
    uVar8 = 0;
    do {
      uVar9 = *(long *)pbVar6 + 0xcfcfcfcfcfcfcfd0;
      if (((*(long *)pbVar6 + 0x4646464646464646U | uVar9) & 0x8080808080808080) != 0) break;
      uVar9 = (uVar9 >> 8) + uVar9 * 10;
      uVar8 = ((uVar9 >> 0x10 & 0xff000000ff) * 0x271000000001 +
               (uVar9 & 0xff000000ff) * 0xf424000000064 >> 0x20) + uVar8 * 100000000;
      pbVar6 = pbVar6 + 8;
      lVar10 = lVar10 + -8;
    } while (7 < lVar10);
  }
  else {
    uVar8 = 0;
  }
  do {
    uVar9 = uVar8;
    if (pbVar6 == (byte *)last) goto LAB_0012ec49;
    bVar2 = int_luts<void>::chdigit[*pbVar6];
    pbVar6 = pbVar6 + 1;
    uVar8 = uVar9 * (uint)base + (ulong)bVar2;
  } while ((int)(uint)bVar2 < base);
  last = (char *)(pbVar6 + ((ulong)((int)(uint)bVar2 < base) - 1));
LAB_0012ec49:
  if ((byte *)last == pbVar7) {
    iVar3 = 0;
    uVar4 = 0x16;
    if (pbVar7 <= pbVar5) goto LAB_0012ece1;
  }
  else {
    uVar4 = 0x22;
    first = last;
    if (*(ulong *)(int_luts<void>::chdigit + (long)base * 8 + 0xf0) <
        (ulong)((long)last - (long)pbVar7)) goto LAB_0012ece1;
    if ((long)last - (long)pbVar7 == *(ulong *)(int_luts<void>::chdigit + (long)base * 8 + 0xf0)) {
      uVar8 = 0x7fffffff;
      if (cVar1 == '-') {
        uVar8 = 0x80000000;
      }
      if (uVar9 < int_luts<void>::min_safe_u64[(long)base + -2]) goto LAB_0012ece1;
    }
    else {
      uVar8 = 0x7fffffff;
      if (cVar1 == '-') {
        uVar8 = 0x80000000;
      }
    }
    if (uVar8 < uVar9) goto LAB_0012ece1;
    iVar3 = -(int)uVar9;
    if (cVar1 != '-') {
      iVar3 = (int)uVar9;
    }
  }
  *value = iVar3;
  uVar4 = 0;
  first = last;
LAB_0012ece1:
  fVar11._8_8_ = uVar4;
  fVar11.ptr = first;
  return fVar11;
}

Assistant:

FASTFLOAT_CONSTEXPR20
from_chars_result_t<UC> from_chars(UC const* first, UC const* last, T& value, int base) noexcept {
  static_assert (is_supported_char_type<UC>(), "only char, wchar_t, char16_t and char32_t are supported");

  from_chars_result_t<UC> answer;
#ifdef FASTFLOAT_SKIP_WHITE_SPACE  // disabled by default
  while ((first != last) && fast_float::is_space(uint8_t(*first))) {
    first++;
  }
#endif
  if (first == last || base < 2 || base > 36) {
    answer.ec = std::errc::invalid_argument;
    answer.ptr = first;
    return answer;
  }
  return parse_int_string(first, last, value, base);
}